

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  GLFWwindow *handle;
  ostream *poVar3;
  
  iVar1 = glfwInit();
  iVar2 = -1;
  if (iVar1 != 0) {
    handle = glfwCreateWindow(0x280,0x1e0,"Hello World",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      glfwTerminate();
    }
    else {
      glfwMakeContextCurrent(handle);
      iVar1 = gladLoadGLLoader(glfwGetProcAddress);
      if (iVar1 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Failed to initialize OpenGL context");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        while (iVar2 = glfwWindowShouldClose(handle), iVar2 == 0) {
          (*glad_glClear)(0x4000);
          glfwSwapBuffers(handle);
          glfwPollEvents();
        }
        glfwTerminate();
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    /* Initialize the library */
    if (!glfwInit())
        return -1;

    /* Create a windowed mode window and its OpenGL context */
    window = glfwCreateWindow(640, 480, "Hello World", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        return -1;
    }

    /* Make the window's context current */
    glfwMakeContextCurrent(window);
    if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress)) {
        std::cout << "Failed to initialize OpenGL context" << std::endl;
        return -1;
    }

    /* Loop until the user closes the window */
    while (!glfwWindowShouldClose(window))
    {
        /* Render here */
        glClear(GL_COLOR_BUFFER_BIT);

        /* Swap front and back buffers */
        glfwSwapBuffers(window);

        /* Poll for and process events */
        glfwPollEvents();
    }

    glfwTerminate();
    return 0;
}